

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalCondition.hpp
# Opt level: O3

Status __thiscall
AO::BehaviorTree::Version_1::Details::DecimalCondition<float,_Agent,_short>::decide
          (DecimalCondition<float,_Agent,_short> *this,EntityPtr entity,short args)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  short local_12;
  EntityPtr local_10;
  
  local_12 = args;
  local_10 = entity;
  if ((this->function).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  fVar2 = (*(this->function)._M_invoker)((_Any_data *)&this->function,&local_10,&local_12);
  bVar1 = true;
  switch(this->condition) {
  case LessThan:
    fVar3 = this->target;
    if (fVar3 <= fVar2) {
      return Failure;
    }
    break;
  case GreaterThan:
    fVar3 = this->target;
    if (fVar2 <= fVar3) {
      return Failure;
    }
    break;
  case LessOrEqualThan:
    fVar3 = this->target;
    if (fVar2 < fVar3) {
      return Success;
    }
    goto LAB_0011a15b;
  case GreaterOrEqualThan:
    fVar3 = this->target;
    if (fVar3 < fVar2) {
      return Success;
    }
    goto LAB_0011a15b;
  case Equal:
    fVar3 = this->target;
LAB_0011a15b:
    return this->epsilon < ABS(fVar2 - fVar3);
  case NotEqual:
    fVar3 = this->target;
    break;
  default:
    goto switchD_0011a12e_default;
  }
  bVar1 = ABS(fVar2 - fVar3) <= this->epsilon;
switchD_0011a12e_default:
  return bVar1;
}

Assistant:

Status decide(EntityPtr entity, Args... args) override final
					{
						DecimalType const result = function(entity, args...);
						switch (condition)
						{
						case ConditionTest::LessThan:
							return result < target && !DecimalCondition::Equals(result, target, epsilon) ? Status::Success : Status::Failure;
						case ConditionTest::GreaterThan:
							return result > target && !DecimalCondition::Equals(result, target, epsilon) ? Status::Success : Status::Failure;
						case ConditionTest::LessOrEqualThan:
							return result < target || DecimalCondition::Equals(result, target, epsilon) ? Status::Success : Status::Failure;
						case ConditionTest::GreaterOrEqualThan:
							return result > target || DecimalCondition::Equals(result, target, epsilon) ? Status::Success : Status::Failure;
						case ConditionTest::Equal:
							return DecimalCondition::Equals(result, target, epsilon) ? Status::Success : Status::Failure;
						case ConditionTest::NotEqual:
							return !DecimalCondition::Equals(result, target, epsilon) ? Status::Success : Status::Failure;
						default:
							return Status::Failure;
						}
					}